

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_versions.cc
# Opt level: O0

uint16_t bssl::ssl_protocol_version(SSL *ssl)

{
  bool bVar1;
  uint16_t local_12;
  SSL *pSStack_10;
  uint16_t version;
  SSL *ssl_local;
  
  pSStack_10 = ssl;
  if (ssl->s3->version == 0) {
    __assert_fail("ssl->s3->version != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_versions.cc"
                  ,0x113,"uint16_t bssl::ssl_protocol_version(const SSL *)");
  }
  bVar1 = ssl_protocol_version_from_wire(&local_12,ssl->s3->version);
  if (!bVar1) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_versions.cc"
                  ,0x117,"uint16_t bssl::ssl_protocol_version(const SSL *)");
  }
  return local_12;
}

Assistant:

uint16_t ssl_protocol_version(const SSL *ssl) {
  assert(ssl->s3->version != 0);
  uint16_t version;
  if (!ssl_protocol_version_from_wire(&version, ssl->s3->version)) {
    // |ssl->s3->version| will always be set to a valid version.
    assert(0);
    return 0;
  }

  return version;
}